

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O1

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertWithExpressions<mp::QuadAndLinTerms,mp::AlgConRhs<0>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                 *con,int i,ConstraintAcceptanceLevel param_3,ExpressionAcceptanceLevel eal)

{
  double dVar1;
  
  if (eal == NotAccepted) {
    return false;
  }
  if (*(int *)(this + 0x40) == 1) {
    HandleLogicalArgs<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>
              (this,con,i);
    if ((((*(size_ty *)
            ((long)&(con->
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                    ).
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                    .args_.super_QuadAndLinTerms.super_QuadTerms.folded_.
                    super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
            + 0x10) != 0) ||
         (*(size_ty *)
           ((long)&(con->
                   super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                   ).
                   super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                   .args_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                   super_small_vector_base<std::allocator<double>,_6U> + 0x10) != 1)) ||
        (dVar1 = *(con->
                  super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                  ).
                  super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>_>
                  .args_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                  super_small_vector_base<std::allocator<double>,_6U>.m_data.
                  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr, dVar1 != 1.0))
       || (NAN(dVar1))) {
      ConvertConditionalConLHS<mp::QuadAndLinTerms,mp::AlgConRhs<0>>(this,con,i);
      return true;
    }
  }
  else {
    Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::
    ConsiderExplicifyingExpression<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>,_true>
              ((Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,con,i);
  }
  return false;
}

Assistant:

bool ConvertWithExpressions(
      const ConditionalConstraint< AlgebraicConstraint<Body, RhsOrRange> >& con,
      int i,
      ConstraintAcceptanceLevel , ExpressionAcceptanceLevel eal) {
    assert(stage_cvt2expr_>0 && stage_cvt2expr_<=2);
    assert(!con.GetContext().IsNone());
    // See if the item is going into an expr.
    // Otherwise it's a flat con.
    if (ExpressionAcceptanceLevel::NotAccepted != eal) {
      if (1==stage_cvt2expr_) {
        HandleLogicalArgs(con, i);         // expicify logical args
        if (!con.GetConstraint().GetBody().is_variable()) {  // already a variable
          ConvertConditionalConLHS(con, i);
          return true;
        }
      }
      else   // if (2==stage_cvt2expr_)
        ConsiderExplicifyingExpression(con, i);        // this is a func con too
    }
    return false;
  }